

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::source(Forth *this)

{
  Cell CVar1;
  
  requireDStackAvailable(this,2,"SOURCE");
  CVar1 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
  ForthStack<unsigned_int>::push(&this->dStack,CVar1);
  CVar1 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  ForthStack<unsigned_int>::push(&this->dStack,CVar1);
  return;
}

Assistant:

void source() {
			REQUIRE_DSTACK_AVAILABLE(2, "SOURCE");
			push(getDataCell(VarOffsetSourceAddress)); 
			push(getDataCell(VarOffsetSourceSize));
		}